

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

bool __thiscall ON_Viewport::SetFrustumNearFar(ON_Viewport *this,double *box_min,double *box_max)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double *box [2];
  double *local_38 [2];
  double local_28;
  undefined8 uStack_20;
  
  pdVar5 = box_min;
  if (box_min == (double *)0x0) {
    pdVar5 = box_max;
  }
  if (box_max == (double *)0x0) {
    box_max = box_min;
  }
  if (((((pdVar5 != (double *)0x0) && (bVar1 = ON_IsValid(*pdVar5), bVar1)) &&
       (bVar1 = ON_IsValid(pdVar5[1]), bVar1)) &&
      ((((bVar1 = ON_IsValid(pdVar5[2]), bVar1 && (bVar1 = ON_IsValid(*box_max), bVar1)) &&
        ((bVar1 = ON_IsValid(box_max[1]), bVar1 &&
         ((bVar1 = ON_IsValid(box_max[2]), bVar1 && (*pdVar5 < *box_max || *pdVar5 == *box_max))))))
       && (pdVar5[1] < box_max[1] || pdVar5[1] == box_max[1])))) &&
     (pdVar5[2] < box_max[2] || pdVar5[2] == box_max[2])) {
    local_38[0] = pdVar5;
    local_38[1] = box_max;
    if (this->m_bValidCamera == true) {
      local_28 = -1.0;
      dVar7 = -1.0;
      for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
        for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
          for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
            dVar8 = ((this->m_CamLoc).z - local_38[lVar4][2]) * (this->m_CamZ).z +
                    ((this->m_CamLoc).y - local_38[lVar3][1]) * (this->m_CamZ).y +
                    ((this->m_CamLoc).x - *local_38[lVar2]) * (this->m_CamZ).x;
            dVar9 = dVar8;
            if ((((int)lVar3 != 0 || (int)lVar2 != 0) || (int)lVar4 != 0) &&
               ((dVar8 < local_28 || (dVar9 = local_28, dVar8 <= dVar7)))) {
              dVar8 = dVar7;
            }
            local_28 = dVar9;
            dVar7 = dVar8;
          }
        }
      }
      uStack_20 = 0;
      bVar1 = ON_IsValid(dVar7);
      if (((bVar1) && (bVar1 = ON_IsValid(local_28), bVar1)) && (0.0 < dVar7)) {
        dVar7 = dVar7 * 1.0625;
        uVar6 = -(ulong)(0.0 < local_28 * 0.9375);
        dVar8 = (double)(uVar6 & (ulong)(local_28 * 0.9375) |
                        ~uVar6 & (ulong)(dVar7 * this->m__MIN_NEAR_OVER_FAR));
        if (this->m_projection != perspective_view) {
          bVar1 = SetFrustumNearFar(this,dVar8,dVar7);
          return bVar1;
        }
        bVar1 = SetFrustumNearFar(this,dVar8,dVar7,this->m__MIN_NEAR_DIST,this->m__MIN_NEAR_OVER_FAR
                                  ,(dVar8 + dVar7) * 0.5);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool ON_Viewport::SetFrustumNearFar( 
       const double* box_min,
       const double* box_max
       )
{
  bool rc = false;
  const double* box[2];
  int i,j,k;
  double n, f, d;
  double camLoc[3], camZ[3], P[3];

  if ( !box_min )
    box_min = box_max;
  if ( !box_max )
    box_max = box_min;
  if ( !box_min )
    return false;

  // 31 May 2007 Dale Lear RR 25980
  //    Add validation of box_min and box_max.
  if ( !ON_IsValid(box_min[0]) || !ON_IsValid(box_min[1]) || !ON_IsValid(box_min[2]) )
    return false;
  if ( !ON_IsValid(box_max[0]) || !ON_IsValid(box_max[1]) || !ON_IsValid(box_max[2]) )
    return false;
  if (    box_min[0] > box_max[0]
       || box_min[1] > box_max[1]
       || box_min[2] > box_max[2]
     )
  {
    return false;
  }
  box[0] = box_min;
  box[1] = box_max;

  if ( GetCameraFrame( camLoc, nullptr, nullptr, camZ ) ) {
    n = f = -1.0;
    for(i=0;i<2;i++)for(j=0;j<2;j++)for(k=0;k<2;k++) {
      P[0] = box[i][0];
      P[1] = box[j][1];
      P[2] = box[k][2];
      d = clipDist(camLoc,camZ,P);
      if (!i&&!j&&!k)
        n=f=d;
      else if ( d < n )
        n = d;
      else if ( d > f )
        f = d;
    }
    if ( !ON_IsValid(f) || !ON_IsValid(n) )
      return false;
    if ( f <= 0.0 )
      return false; // box is behind camera
    n *= 0.9375;
    f *= 1.0625;
    if ( n <= 0.0 )
      n = m__MIN_NEAR_OVER_FAR*f;
    if ( IsPerspectiveProjection() )
      rc = SetFrustumNearFar( n, f, m__MIN_NEAR_DIST, m__MIN_NEAR_OVER_FAR, 0.5*(n+f) );
    else
      rc = SetFrustumNearFar( n, f );
  }
  return rc;
}